

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteBeginGlobal(WatWriter *this,Global *global)

{
  string_view str;
  NextChar in_R8D;
  
  WriteOpenSpace(this,"global");
  str.data_ = (global->name)._M_dataplus._M_p;
  str.size_ = (global->name)._M_string_length;
  WriteNameOrIndex(this,str,this->global_index_,in_R8D);
  WriteInlineExports(this,Global,this->global_index_);
  WriteInlineImport(this,Global,this->global_index_);
  if (global->mutable_ == true) {
    WriteOpenSpace(this,"mut");
    WriteType(this,(Type)(global->type).enum_,Space);
    WriteCloseSpace(this);
  }
  else {
    WriteType(this,(Type)(global->type).enum_,Space);
  }
  this->global_index_ = this->global_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginGlobal(const Global& global) {
  WriteOpenSpace("global");
  WriteNameOrIndex(global.name, global_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Global, global_index_);
  WriteInlineImport(ExternalKind::Global, global_index_);
  if (global.mutable_) {
    WriteOpenSpace("mut");
    WriteType(global.type, NextChar::Space);
    WriteCloseSpace();
  } else {
    WriteType(global.type, NextChar::Space);
  }
  global_index_++;
}